

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::drawSubtreeRecursive
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QRegion *exposedRegion,QWidget *widget,qreal parentOpacity,
          QTransform *effectTransform)

{
  undefined1 *puVar1;
  quint32 qVar2;
  long lVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsEffect *pQVar5;
  QGraphicsItemEffectSourcePrivate *this_00;
  double dVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  qreal *pqVar10;
  QTransform *pQVar11;
  qreal *pqVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  QRectF *pQVar16;
  QTransform *pQVar17;
  undefined8 *puVar18;
  QTransform *pQVar19;
  QGraphicsItemPaintInfo *pQVar20;
  long in_FS_OFFSET;
  bool wasDirtyParentSceneTransform;
  bool bVar21;
  byte bVar22;
  qreal opacity;
  undefined1 auVar23 [16];
  QWidget *copy;
  QGraphicsItemPaintInfo info;
  QTransform local_128;
  QRectF boundingRect;
  undefined2 local_90;
  QTransform transform;
  
  bVar22 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (item->d_ptr).d;
  uVar14 = *(ulong *)&pQVar4->field_0x160;
  if (((uVar14 & 0x20) == 0) ||
     (lVar13 = (pQVar4->children).d.size, ((byte)(uVar14 >> 0x2a) & lVar13 == 0) != 0))
  goto LAB_0060c986;
  if ((((uint)(uVar14 >> 0x26) & 1) == 0 && pQVar4->parent != (QGraphicsItem *)0x0) &&
     ((((pQVar4->parent->d_ptr).d)->field_0x164 & 0x80) == 0)) {
    opacity = parentOpacity * pQVar4->opacity;
  }
  else {
    opacity = pQVar4->opacity;
  }
  if (opacity < 0.001) {
    if (lVar13 == 0) goto LAB_0060c986;
    if ((uVar14 >> 0x27 & 1) == 0) {
      lVar15 = 0;
      do {
        if ((*(ulong *)&(((pQVar4->children).d.ptr[lVar15]->d_ptr).d)->field_0x160 & 0x4000000000)
            != 0) goto LAB_0060c223;
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
      goto LAB_0060c986;
    }
  }
LAB_0060c223:
  pQVar11 = &transform;
  pqVar10 = (qreal *)&DAT_006f3c60;
  pQVar17 = pQVar11;
  for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
    pQVar17->m_matrix[0][0] = *pqVar10;
    pqVar10 = pqVar10 + 1;
    pQVar17 = (QTransform *)(pQVar17->m_matrix[0] + 1);
  }
  if ((uVar14 & 0x2000040000) == 0) {
    wasDirtyParentSceneTransform = (uVar14 >> 0x35 & 1) != 0;
    if (wasDirtyParentSceneTransform) {
      (*pQVar4->_vptr_QGraphicsItemPrivate[2])(pQVar4);
    }
    pQVar11 = (QTransform *)0x0;
  }
  else {
    if (viewTransform == (QTransform *)0x0) {
      pqVar10 = (qreal *)&DAT_006f3c18;
      pqVar12 = (qreal *)&local_128;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *pqVar12 = *pqVar10;
        pqVar10 = pqVar10 + 1;
        pqVar12 = pqVar12 + 1;
      }
      local_128._72_2_ = 0;
    }
    else {
      pqVar10 = (qreal *)viewTransform;
      pqVar12 = (qreal *)&local_128;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *pqVar12 = *pqVar10;
        pqVar10 = pqVar10 + 1;
        pqVar12 = pqVar12 + 1;
      }
      local_128._72_2_ = *(undefined2 *)&viewTransform->field_0x48;
    }
    QGraphicsItem::deviceTransform((QTransform *)&boundingRect,item,&local_128);
    pQVar16 = &boundingRect;
    pQVar17 = pQVar11;
    for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
      pQVar17->m_matrix[0][0] = (*(qreal (*) [3])&pQVar16->xp)[0];
      pQVar16 = (QRectF *)((long)pQVar16 + (ulong)bVar22 * -0x10 + 8);
      pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar22 * -0x10 + 8);
    }
    transform._72_2_ = local_90;
    wasDirtyParentSceneTransform = false;
  }
  bVar21 = (uVar14 >> 0x2a & 1) == 0;
  pQVar4 = (item->d_ptr).d;
  uVar14 = *(ulong *)&pQVar4->field_0x160;
  bVar7 = bVar21 && 0.001 <= opacity;
  if ((bVar7) || (0.0 < this->minimumRenderSize)) {
    boundingRect.w = -NAN;
    boundingRect.h = -NAN;
    boundingRect.yp._0_4_ = 0xffffffff;
    boundingRect.xp = -NAN;
    boundingRect.yp._4_4_ = 0xffffffff;
    QGraphicsItemPrivate::effectiveBoundingRect(&boundingRect,pQVar4,(QGraphicsItem *)0x0);
    if ((boundingRect.w == 0.0) && (!NAN(boundingRect.w))) {
      boundingRect.yp = boundingRect.yp + 0.0;
      boundingRect.xp = boundingRect.xp + -1e-05;
      boundingRect.w = boundingRect.w + 2e-05;
      boundingRect.h = boundingRect.h + 0.0;
    }
    if ((boundingRect.h == 0.0) && (!NAN(boundingRect.h))) {
      dVar6 = boundingRect.yp + -1e-05;
      boundingRect.yp._0_4_ = SUB84(dVar6,0);
      boundingRect.xp = boundingRect.xp + 0.0;
      boundingRect.yp._4_4_ = (int)((ulong)dVar6 >> 0x20);
      boundingRect.h = boundingRect.h + 2e-05;
    }
    if (pQVar11 == (QTransform *)0x0) {
      pQVar4 = (item->d_ptr).d;
      pQVar17 = &pQVar4->sceneTransform;
      if (viewTransform != (QTransform *)0x0) {
        pQVar11 = &transform;
        pQVar19 = pQVar11;
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          pQVar19->m_matrix[0][0] = pQVar17->m_matrix[0][0];
          pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar22 * -0x10 + 8);
          pQVar19 = (QTransform *)((long)pQVar19 + (ulong)bVar22 * -0x10 + 8);
        }
        transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
        QTransform::operator*=(pQVar11,viewTransform);
        goto LAB_0060c507;
      }
      pQVar11 = pQVar17;
      if ((*(ulong *)&pQVar4->field_0x160 >> 0x3e & 1) == 0) goto LAB_0060c507;
      dVar6 = (pQVar4->sceneTransform).m_matrix[2][1] + boundingRect.yp;
      local_128.m_matrix[0][1]._0_4_ = SUB84(dVar6,0);
      local_128.m_matrix[0][0] = (pQVar4->sceneTransform).m_matrix[2][0] + boundingRect.xp;
      local_128.m_matrix[0][1]._4_4_ = (int)((ulong)dVar6 >> 0x20);
      local_128.m_matrix[0][2] = boundingRect.w;
      local_128.m_matrix[1][0] = boundingRect.h;
    }
    else {
LAB_0060c507:
      local_128.m_matrix[0][1]._0_4_ = 0xffffffff;
      local_128.m_matrix[0][0] = -NAN;
      local_128.m_matrix[1][0] = -NAN;
      local_128.m_matrix[0][2] = -NAN;
      local_128.m_matrix[0][1]._4_4_ = 0xffffffff;
      QTransform::mapRect((QRectF *)&local_128);
    }
    dVar6 = this->minimumRenderSize;
    if ((dVar6 <= 0.0) ||
       ((dVar6 <= local_128.m_matrix[0][2] && (dVar6 <= local_128.m_matrix[1][0])))) {
      if (!bVar21 || 0.001 > opacity) goto LAB_0060c5e7;
      info.viewTransform = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
      info.transformPtr = (QTransform *)&DAT_aaaaaaaaaaaaaaaa;
      auVar23 = QRectF::toAlignedRect();
      qVar2 = this->rectAdjust;
      info.viewTransform = (QTransform *)CONCAT44(auVar23._4_4_ - qVar2,auVar23._0_4_ - qVar2);
      info.transformPtr = (QTransform *)CONCAT44(auVar23._12_4_ + qVar2,auVar23._8_4_ + qVar2);
      if (widget != (QWidget *)0x0) {
        copy = widget;
        QHash<QWidget*,QRect>::emplace<QRect_const&>
                  ((QHash<QWidget*,QRect> *)&((item->d_ptr).d)->paintedViewBoundingRects,&copy,
                   (QRect *)&info);
      }
      if (exposedRegion == (QRegion *)0x0) {
        auVar23 = QRect::normalized();
        cVar8 = auVar23._4_4_ <= auVar23._12_4_ && auVar23._0_4_ <= auVar23._8_4_;
      }
      else {
        cVar8 = QRegion::intersects((QRect *)exposedRegion);
      }
      if (cVar8 != '\0') goto LAB_0060c6e8;
    }
    else {
      cVar8 = '\0';
    }
    if (lVar13 == 0) goto LAB_0060c986;
    if ((uVar14 & 0x8001000000000) != 0) {
      if ((wasDirtyParentSceneTransform != false) &&
         (pQVar4 = (item->d_ptr).d, (pQVar4->children).d.size != 0)) {
        uVar14 = 0;
        do {
          puVar1 = &(((pQVar4->children).d.ptr[uVar14]->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)(pQVar4->children).d.size);
      }
      goto LAB_0060c986;
    }
  }
  else {
    cVar8 = false;
    if (((lVar13 != 0) && (pQVar11 == (QTransform *)0x0)) && ((uVar14 & 0x8001000000000) != 0)) {
      pQVar11 = &pQVar4->sceneTransform;
      if (viewTransform == (QTransform *)0x0) {
        cVar8 = false;
      }
      else {
        pQVar17 = &transform;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          pQVar17->m_matrix[0][0] = pQVar11->m_matrix[0][0];
          pQVar11 = (QTransform *)((long)pQVar11 + (ulong)bVar22 * -0x10 + 8);
          pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar22 * -0x10 + 8);
        }
        transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
        QTransform::operator*=(&transform,viewTransform);
        pQVar11 = &transform;
LAB_0060c5e7:
        cVar8 = false;
      }
    }
  }
LAB_0060c6e8:
  pQVar5 = ((item->d_ptr).d)->graphicsEffect;
  if ((pQVar5 == (QGraphicsEffect *)0x0) || (bVar21 = QGraphicsEffect::isEnabled(pQVar5), !bVar21))
  {
    draw(this,item,painter,viewTransform,pQVar11,exposedRegion,widget,opacity,effectTransform,
         wasDirtyParentSceneTransform,(bool)cVar8);
    goto LAB_0060c986;
  }
  if (pQVar11 == (QTransform *)0x0) {
    pQVar4 = (item->d_ptr).d;
    pQVar17 = &pQVar4->sceneTransform;
    pQVar11 = pQVar17;
    if (viewTransform != (QTransform *)0x0) {
      pQVar11 = &transform;
      pQVar19 = pQVar11;
      for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
        pQVar19->m_matrix[0][0] = pQVar17->m_matrix[0][0];
        pQVar17 = (QTransform *)((long)pQVar17 + (ulong)bVar22 * -0x10 + 8);
        pQVar19 = (QTransform *)((long)pQVar19 + (ulong)bVar22 * -0x10 + 8);
      }
      transform._72_2_ = *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
      QTransform::operator*=(pQVar11,viewTransform);
    }
  }
  puVar18 = &DAT_006f3538;
  pQVar20 = &info;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    pQVar20->viewTransform = (QTransform *)*puVar18;
    puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
    pQVar20 = (QGraphicsItemPaintInfo *)((long)pQVar20 + (ulong)bVar22 * -0x10 + 8);
  }
  info.option = &this->styleOptionTmp;
  info.effectTransform = effectTransform;
  info._64_1_ = bVar7 * '\x02' + wasDirtyParentSceneTransform | 0xa8;
  this_00 = *(QGraphicsItemEffectSourcePrivate **)
             (*(long *)(*(long *)&((item->d_ptr).d)->graphicsEffect->field_0x8 + 0x78) + 8);
  this_00->info = &info;
  info.viewTransform = viewTransform;
  info.transformPtr = pQVar11;
  info.exposedRegion = exposedRegion;
  info.widget = widget;
  info.painter = painter;
  info.opacity = opacity;
  pqVar10 = (qreal *)QPainter::worldTransform();
  pQVar16 = &boundingRect;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pQVar16->xp = *pqVar10;
    pqVar10 = pqVar10 + (ulong)bVar22 * -2 + 1;
    pQVar16 = (QRectF *)((long)pQVar16 + (ulong)bVar22 * -0x10 + 8);
  }
  if (effectTransform != (QTransform *)0x0) {
    QTransform::operator*(&local_128,pQVar11);
    pQVar11 = &local_128;
  }
  QPainter::setWorldTransform((QTransform *)painter,SUB81(pQVar11,0));
  QPainter::setOpacity(opacity);
  if ((this_00->super_QGraphicsEffectSourcePrivate).m_cachedSystem != LogicalCoordinates) {
    pQVar11 = (QTransform *)QPainter::worldTransform();
    cVar8 = QTransform::operator!=(&this_00->lastEffectTransform,pQVar11);
    if (cVar8 != '\0') {
      iVar9 = QTransform::type();
      if (iVar9 < 2) {
        QPainter::worldTransform();
        iVar9 = QTransform::type();
        if (1 < iVar9) goto LAB_0060c928;
        local_128.m_matrix[0][2] = -NAN;
        local_128.m_matrix[1][0] = -NAN;
        local_128.m_matrix[0][1]._0_4_ = 0xffffffff;
        local_128.m_matrix[0][0] = -NAN;
        local_128.m_matrix[0][1]._4_4_ = 0xffffffff;
        (**(code **)(*(long *)&this_00->super_QGraphicsEffectSourcePrivate + 0x28))
                  ((QRectF *)&local_128,this_00,0);
        QGraphicsItemEffectSourcePrivate::paddedEffectRect
                  ((QRectF *)&copy,this_00,DeviceCoordinates,
                   (this_00->super_QGraphicsEffectSourcePrivate).m_cachedMode,(QRectF *)&local_128,
                   (bool *)0x0);
        copy = (QWidget *)QRectF::toAlignedRect();
        QGraphicsEffectSourcePrivate::setCachedOffset
                  (&this_00->super_QGraphicsEffectSourcePrivate,(QPoint *)&copy);
      }
      else {
LAB_0060c928:
        QGraphicsEffectSourcePrivate::invalidateCache
                  (&this_00->super_QGraphicsEffectSourcePrivate,TransformChanged);
      }
      pqVar12 = (qreal *)QPainter::worldTransform();
      pqVar10 = pqVar12;
      pQVar11 = &this_00->lastEffectTransform;
      for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
        pQVar11->m_matrix[0][0] = *pqVar10;
        pqVar10 = pqVar10 + (ulong)bVar22 * -2 + 1;
        pQVar11 = (QTransform *)((long)pQVar11 + (ulong)bVar22 * -0x10 + 8);
      }
      *(undefined2 *)&(this_00->lastEffectTransform).field_0x48 = *(undefined2 *)(pqVar12 + 9);
    }
  }
  pQVar5 = ((item->d_ptr).d)->graphicsEffect;
  (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,painter);
  QPainter::setWorldTransform((QTransform *)painter,SUB81(&boundingRect,0));
  this_00->info = (QGraphicsItemPaintInfo *)0x0;
LAB_0060c986:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::drawSubtreeRecursive(QGraphicsItem *item, QPainter *painter,
                                                 const QTransform *const viewTransform,
                                                 QRegion *exposedRegion, QWidget *widget,
                                                 qreal parentOpacity, const QTransform *const effectTransform)
{
    Q_ASSERT(item);

    if (!item->d_ptr->visible)
        return;

    const bool itemHasContents = !(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents);
    const bool itemHasChildren = !item->d_ptr->children.isEmpty();
    if (!itemHasContents && !itemHasChildren)
        return; // Item has neither contents nor children!(?)

    const qreal opacity = item->d_ptr->combineOpacityFromParent(parentOpacity);
    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    if (itemIsFullyTransparent && (!itemHasChildren || item->d_ptr->childrenCombineOpacity()))
        return;

    QTransform transform(Qt::Uninitialized);
    QTransform *transformPtr = nullptr;
    bool translateOnlyTransform = false;
#define ENSURE_TRANSFORM_PTR \
    if (!transformPtr) { \
        Q_ASSERT(!itemIsUntransformable); \
        if (viewTransform) { \
            transform = item->d_ptr->sceneTransform; \
            transform *= *viewTransform; \
            transformPtr = &transform; \
        } else { \
            transformPtr = &item->d_ptr->sceneTransform; \
            translateOnlyTransform = item->d_ptr->sceneTransformTranslateOnly; \
        } \
    }

    // Update the item's scene transform if the item is transformable;
    // otherwise calculate the full transform,
    bool wasDirtyParentSceneTransform = false;
    const bool itemIsUntransformable = item->d_ptr->itemIsUntransformable();
    if (itemIsUntransformable) {
        transform = item->deviceTransform(viewTransform ? *viewTransform : QTransform());
        transformPtr = &transform;
    } else if (item->d_ptr->dirtySceneTransform) {
        item->d_ptr->updateSceneTransformFromParent();
        Q_ASSERT(!item->d_ptr->dirtySceneTransform);
        wasDirtyParentSceneTransform = true;
    }

    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                           || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape);
    bool drawItem = itemHasContents && !itemIsFullyTransparent;
    if (drawItem || minimumRenderSize > 0.0) {
        const QRectF brect = adjustedItemEffectiveBoundingRect(item);
        ENSURE_TRANSFORM_PTR
        QRectF preciseViewBoundingRect = translateOnlyTransform ? brect.translated(transformPtr->dx(), transformPtr->dy())
                                                                : transformPtr->mapRect(brect);

        bool itemIsTooSmallToRender = false;
        if (minimumRenderSize > 0.0
            && (preciseViewBoundingRect.width() < minimumRenderSize
                || preciseViewBoundingRect.height() < minimumRenderSize)) {
           itemIsTooSmallToRender = true;
           drawItem = false;
        }

        bool itemIsOutsideVisibleRect = false;
        if (drawItem) {
            QRect viewBoundingRect = preciseViewBoundingRect.toAlignedRect();
            viewBoundingRect.adjust(-int(rectAdjust), -int(rectAdjust), rectAdjust, rectAdjust);
            if (widget)
                item->d_ptr->paintedViewBoundingRects.insert(widget, viewBoundingRect);
            drawItem = exposedRegion ? exposedRegion->intersects(viewBoundingRect)
                                     : !viewBoundingRect.normalized().isEmpty();
            itemIsOutsideVisibleRect = !drawItem;
        }

        if (itemIsTooSmallToRender || itemIsOutsideVisibleRect) {
            // We cannot simply use !drawItem here. If we did it is possible
            // to enter the outer if statement with drawItem == false and minimumRenderSize > 0
            // and finally end up inside this inner if, even though none of the above two
            // conditions are met. In that case we should not return from this function
            // but call draw() instead.
            if (!itemHasChildren)
                return;
            if (itemClipsChildrenToShape) {
                if (wasDirtyParentSceneTransform)
                    item->d_ptr->invalidateChildrenSceneTransform();
                return;
            }
        }
    } // else we know for sure this item has children we must process.

    if (itemHasChildren && itemClipsChildrenToShape)
        ENSURE_TRANSFORM_PTR;

#if QT_CONFIG(graphicseffect)
    if (item->d_ptr->graphicsEffect && item->d_ptr->graphicsEffect->isEnabled()) {
        ENSURE_TRANSFORM_PTR;
        QGraphicsItemPaintInfo info(viewTransform, transformPtr, effectTransform, exposedRegion, widget, &styleOptionTmp,
                                    painter, opacity, wasDirtyParentSceneTransform, itemHasContents && !itemIsFullyTransparent);
        QGraphicsEffectSource *source = item->d_ptr->graphicsEffect->d_func()->source;
        QGraphicsItemEffectSourcePrivate *sourced = static_cast<QGraphicsItemEffectSourcePrivate *>
                                                    (source->d_func());
        sourced->info = &info;
        const QTransform restoreTransform = painter->worldTransform();
        if (effectTransform)
            painter->setWorldTransform(*transformPtr * *effectTransform);
        else
            painter->setWorldTransform(*transformPtr);
        painter->setOpacity(opacity);

        if (sourced->currentCachedSystem() != Qt::LogicalCoordinates
            && sourced->lastEffectTransform != painter->worldTransform())
        {
            if (sourced->lastEffectTransform.type() <= QTransform::TxTranslate
                && painter->worldTransform().type() <= QTransform::TxTranslate)
            {
                QRectF sourceRect = sourced->boundingRect(Qt::DeviceCoordinates);
                QRect effectRect = sourced->paddedEffectRect(Qt::DeviceCoordinates, sourced->currentCachedMode(), sourceRect).toAlignedRect();

                sourced->setCachedOffset(effectRect.topLeft());
            } else {
                sourced->invalidateCache(QGraphicsEffectSourcePrivate::TransformChanged);
            }

            sourced->lastEffectTransform = painter->worldTransform();
        }

        item->d_ptr->graphicsEffect->draw(painter);
        painter->setWorldTransform(restoreTransform);
        sourced->info = nullptr;
    } else
#endif // QT_CONFIG(graphicseffect)
    {
        draw(item, painter, viewTransform, transformPtr, exposedRegion, widget, opacity,
             effectTransform, wasDirtyParentSceneTransform, drawItem);
    }
}